

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMask::ResetNconstr(ChLinkMask *this,int newnconstr)

{
  vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_> *this_00
  ;
  int iVar1;
  ChConstraintTwoBodies *pCVar2;
  int i_1;
  int i;
  long lVar3;
  
  iVar1 = this->nconstr;
  if (iVar1 != newnconstr) {
    this_00 = &this->constraints;
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      pCVar2 = (this_00->
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar3];
      if (pCVar2 != (ChConstraintTwoBodies *)0x0) {
        (**(code **)((long)(pCVar2->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8
                    ))();
        (this->constraints).
        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar3] = (ChConstraintTwoBodies *)0x0;
        iVar1 = this->nconstr;
      }
    }
    this->nconstr = newnconstr;
    std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
    resize(this_00,(long)newnconstr);
    for (lVar3 = 0; lVar3 < this->nconstr; lVar3 = lVar3 + 1) {
      pCVar2 = (ChConstraintTwoBodies *)Eigen::internal::aligned_malloc(0x120);
      ChConstraintTwoBodies::ChConstraintTwoBodies(pCVar2);
      (this_00->
      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
      )._M_impl.super__Vector_impl_data._M_start[lVar3] = pCVar2;
    }
  }
  return;
}

Assistant:

void ChLinkMask::ResetNconstr(int newnconstr) {
    if (nconstr != newnconstr) {
        for (int i = 0; i < nconstr; i++)
            if (constraints[i]) {
                delete constraints[i];
                constraints[i] = nullptr;
            }

        nconstr = newnconstr;

        constraints.resize(nconstr);

        for (int i = 0; i < nconstr; i++) {
            constraints[i] = new ChConstraintTwoBodies;
        }
    }
}